

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Client::create_client(Client *this)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nEnter Client\'s id :",0x14);
  std::istream::operator>>(&std::cin,&this->id);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nEnter the Client\'s Name :",0x1a);
  std::istream::ignore();
  std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
  std::istream::getline((char *)&std::cin,(long)this,'1');
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nEnter The Client Class : ",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\t\t\t\t\t1. Regular Client",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\t\t\t\t\t2. Golden Client",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\t\t\t\t\t3. VIP Client",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\t\t\t\t==>>Enter Your Choice: ",0x1d);
  std::istream::operator>>(&std::cin,&this->client_class);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nEnter Client\'s Birthdate (dd-mm-yyyy):",0x27);
  std::__istream_extract((istream *)&std::cin,this->bdate,0x7fffffffffffffff);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nEnter The Type of Gender (m=0/f=1): ",0x25);
  std::istream::_M_extract<bool>((bool *)&std::cin);
  return;
}

Assistant:

void Client::create_client() {
    /*!
     * To add a client to the banking system we need to determine:
     * id: id of the client
     * name: client named
     * client_class: current class of the client
     * bdate: birthdate (dd-mm-yyyy) as a string value
     *
     */

    std::cout<<"\nEnter Client's id :";
    std::cin>>id;
    std::cout<<"\nEnter the Client's Name :";
    std::cin.ignore();
    std::cin.getline(name,49);
    std::cout<<"\nEnter The Client Class : ";
    std::cout<<"\n\n\t\t\t\t\t1. Regular Client";
    std::cout<<"\n\n\t\t\t\t\t2. Golden Client";
    std::cout<<"\n\n\t\t\t\t\t3. VIP Client";
    std::cout<<"\n\n\t\t\t\t==>>Enter Your Choice: ";
    std::cin>>client_class;
    std::cout<<"\nEnter Client's Birthdate (dd-mm-yyyy):";
    std::cin>>bdate;
    std::cout<<"\nEnter The Type of Gender (m=0/f=1): ";
    std::cin>>gender;

}